

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# worker.cpp
# Opt level: O0

void __thiscall acto::core::worker_t::~worker_t(worker_t *this)

{
  bool bVar1;
  worker_t *this_local;
  
  std::atomic<bool>::operator=(&this->active_,false);
  event::signaled(&this->wakeup_event_);
  bVar1 = std::thread::joinable(&this->thread_);
  if (bVar1) {
    std::thread::join();
  }
  std::thread::~thread(&this->thread_);
  event::~event(&this->wakeup_event_);
  return;
}

Assistant:

worker_t::~worker_t() {
  active_ = false;
  wakeup_event_.signaled();

  if (thread_.joinable()) {
    thread_.join();
  }
}